

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O3

void Abc_NtkLogicMakeDirectSops(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  int iVar2;
  uint numVars;
  Vec_Ptr_t *pVVar3;
  DdManager *dd;
  Vec_Str_t *vCube;
  char *pcVar4;
  DdNode *n;
  long lVar5;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcFunc.c"
                  ,0x223,"void Abc_NtkLogicMakeDirectSops(Abc_Ntk_t *)");
  }
  pVVar3 = pNtk->vObjs;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      plVar1 = (long *)pVVar3->pArray[lVar5];
      if (((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) &&
         ((*(int *)(*plVar1 + 4) != 4 || ((*(int *)((long)plVar1 + 0x1c) != 1 || (plVar1[7] != 0))))
         )) {
        iVar2 = Abc_SopIsComplement((char *)plVar1[7]);
        if (iVar2 != 0) {
          numVars = Abc_NtkGetFaninMax(pNtk);
          if (numVars == 0) {
            puts("Warning: The network has only constant nodes.");
          }
          dd = Cudd_Init(numVars,0,0x100,0x40000,0);
          vCube = (Vec_Str_t *)malloc(0x10);
          vCube->nCap = 100;
          vCube->nSize = 0;
          pcVar4 = (char *)malloc(100);
          vCube->pArray = pcVar4;
          pVVar3 = pNtk->vObjs;
          if (0 < pVVar3->nSize) {
            lVar5 = 0;
            do {
              plVar1 = (long *)pVVar3->pArray[lVar5];
              if (((plVar1 != (long *)0x0) && ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 7)) &&
                 ((*(int *)(*plVar1 + 4) != 4 ||
                  ((*(int *)((long)plVar1 + 0x1c) != 1 || (plVar1[7] != 0)))))) {
                iVar2 = Abc_SopIsComplement((char *)plVar1[7]);
                if (iVar2 != 0) {
                  n = Abc_ConvertSopToBdd(dd,(char *)plVar1[7],(DdNode **)0x0);
                  Cudd_Ref(n);
                  pcVar4 = Abc_ConvertBddToSop((Mem_Flex_t *)pNtk->pManFunc,dd,n,n,
                                               *(int *)((long)plVar1 + 0x1c),0,vCube,1);
                  plVar1[7] = (long)pcVar4;
                  Cudd_RecursiveDeref(dd,n);
                  iVar2 = Abc_SopIsComplement((char *)plVar1[7]);
                  if (iVar2 != 0) {
                    __assert_fail("!Abc_SopIsComplement((char *)pNode->pData)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcFunc.c"
                                  ,0x23e,"void Abc_NtkLogicMakeDirectSops(Abc_Ntk_t *)");
                  }
                }
              }
              lVar5 = lVar5 + 1;
              pVVar3 = pNtk->vObjs;
            } while (lVar5 < pVVar3->nSize);
            pcVar4 = vCube->pArray;
          }
          if (pcVar4 != (char *)0x0) {
            free(pcVar4);
          }
          free(vCube);
          Extra_StopManager(dd);
          return;
        }
        pVVar3 = pNtk->vObjs;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Abc_NtkLogicMakeDirectSops( Abc_Ntk_t * pNtk )
{
    DdManager * dd;
    DdNode * bFunc;
    Vec_Str_t * vCube;
    Abc_Obj_t * pNode;
    int nFaninsMax, fFound, i;

    assert( Abc_NtkHasSop(pNtk) );

    // check if there are nodes with complemented SOPs
    fFound = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Abc_ObjIsBarBuf(pNode) && Abc_SopIsComplement((char *)pNode->pData) )
        {
            fFound = 1;
            break;
        }
    if ( !fFound )
        return;

    // start the BDD package
    nFaninsMax = Abc_NtkGetFaninMax( pNtk );
    if ( nFaninsMax == 0 )
        printf( "Warning: The network has only constant nodes.\n" );
    dd = Cudd_Init( nFaninsMax, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );

    // change the cover of negated nodes
    vCube = Vec_StrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Abc_ObjIsBarBuf(pNode) && Abc_SopIsComplement((char *)pNode->pData) )
        {
            bFunc = Abc_ConvertSopToBdd( dd, (char *)pNode->pData, NULL );  Cudd_Ref( bFunc );
            pNode->pData = Abc_ConvertBddToSop( (Mem_Flex_t *)pNtk->pManFunc, dd, bFunc, bFunc, Abc_ObjFaninNum(pNode), 0, vCube, 1 );
            Cudd_RecursiveDeref( dd, bFunc );
            assert( !Abc_SopIsComplement((char *)pNode->pData) );
        }
    Vec_StrFree( vCube );
    Extra_StopManager( dd );
}